

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sys_rand.c
# Opt level: O0

int randombytes_sysrandom_buf(void *buf,size_t size)

{
  int iVar1;
  ssize_t sVar2;
  long in_RSI;
  size_t in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  randombytes_sysrandom_stir_if_needed();
  if (stream.getrandom_available == 0) {
    if ((stream.random_data_source_fd != -1) &&
       (sVar2 = safe_read(buf._4_4_,(void *)size,
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)),
       sVar2 == in_RSI)) {
      return 0;
    }
    iVar1 = -1;
  }
  else {
    iVar1 = randombytes_linux_getrandom
                      ((void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI)
    ;
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

static int randombytes_sysrandom_buf(void * const buf, const size_t size)
{
    randombytes_sysrandom_stir_if_needed();
#if defined(ULONG_LONG_MAX) && defined(SIZE_MAX)
# if SIZE_MAX > ULONG_LONG_MAX
    /* coverity[result_independent_of_operands] */
    assert(size <= ULONG_LONG_MAX);
# endif
#endif
#ifndef _WIN32
# if defined(SYS_getrandom) && defined(__NR_getrandom)
    if (stream.getrandom_available != 0) 
    {
        if (randombytes_linux_getrandom(buf, size) != 0) 
        {
            return -1;
        }
        return 0;
    }
# endif
    if (stream.random_data_source_fd == -1 ||
        safe_read(stream.random_data_source_fd, buf, size) != (ssize_t) size) 
    {
        return -1;
    }
#else
   // COMPILER_ASSERT(randombytes_BYTES_MAX <= 0xffffffffUL);
    if (size > (size_t) 0xffffffffUL) {
        return -1;
    }
    if (! RtlGenRandom((PVOID) buf, (ULONG) size)) {
        return -1;
    }
#endif
    return 0;
}